

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void CreateDefaultConstructorCode
               (ExpressionContext *ctx,SynBase *source,TypeClass *classType,
               IntrusiveList<ExprBase> *expressions)

{
  MemberHandle *pMVar1;
  VariableData *variable;
  TypeBase *pTVar2;
  SynBase *pSVar3;
  TypeStruct *pTVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  ExprBase *pEVar8;
  ExprBase *address;
  TypeRef *type;
  undefined4 extraout_var;
  ExprBase *pEVar9;
  undefined4 extraout_var_00;
  ExprZeroInitialize *this;
  undefined4 extraout_var_01;
  ulong uVar10;
  SynBase *source_00;
  MemberHandle *pMVar11;
  InplaceStr name;
  InplaceStr local_48;
  SynBase *local_38;
  
  pMVar1 = (classType->super_TypeStruct).members.head;
  local_38 = source;
  do {
    if (pMVar1 == (MemberHandle *)0x0) {
      return;
    }
    variable = pMVar1->variable;
    if ((classType->baseClass == (TypeClass *)0x0) ||
       (pMVar11 = (classType->baseClass->super_TypeStruct).members.head,
       pMVar11 == (MemberHandle *)0x0)) {
LAB_00179cb1:
      pSVar3 = local_38;
      source_00 = pMVar1->source;
      if (pMVar1->source == (SynBase *)0x0) {
        source_00 = local_38;
      }
      uVar10 = 1;
      pEVar8 = CreateVariableAccess(ctx,source_00,variable,true);
      address = CreateGetAddress(ctx,pSVar3,pEVar8);
      local_48.begin = "$typeid";
      local_48.end = "";
      bVar6 = InplaceStr::operator==(&variable->name->name,&local_48);
      if (bVar6) {
        if (classType->baseClass != (TypeClass *)0x0) {
          bVar6 = HasDefaultConstructor(ctx,source_00,(TypeBase *)classType->baseClass);
          if (!bVar6) {
            __assert_fail("HasDefaultConstructor(ctx, memberSource, classType->baseClass)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2783,
                          "void CreateDefaultConstructorCode(ExpressionContext &, SynBase *, TypeClass *, IntrusiveList<ExprBase> &)"
                         );
          }
          name.end = "";
          name.begin = "this";
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar10;
          pEVar8 = CreateVariableAccess
                             (ctx,source_00,(IntrusiveList<SynIdentifier>)(auVar5 << 0x40),name,
                              false);
          if (pEVar8 == (ExprBase *)0x0) {
            anon_unknown.dwarf_c3752::Stop
                      (ctx,source_00,"ERROR: \'this\' variable is not available");
          }
          type = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType->baseClass);
          pEVar8 = CreateCast(ctx,source_00,pEVar8,&type->super_TypeBase,true);
          pEVar8 = CreateDefaultConstructorCall
                             (ctx,source_00,(TypeBase *)classType->baseClass,pEVar8);
          if (pEVar8 != (ExprBase *)0x0) {
            IntrusiveList<ExprBase>::push_back(expressions,pEVar8);
          }
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
        pTVar2 = ctx->typeTypeID;
        pEVar8->typeID = 8;
        pEVar8->source = source_00;
        pEVar8->type = pTVar2;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240570;
        pEVar8[1]._vptr_ExprBase = (_func_int **)classType;
        pEVar8 = CreateAssignment(ctx,source_00,address,pEVar8);
LAB_00179e13:
        IntrusiveList<ExprBase>::push_back(expressions,pEVar8);
      }
      else {
        pSVar3 = pMVar1->initializer;
        if (pSVar3 == (SynBase *)0x0) {
          bVar6 = HasDefaultConstructor(ctx,source_00,variable->type);
          if (bVar6) {
            pEVar8 = CreateDefaultConstructorCall(ctx,source_00,variable->type,address);
            if (pEVar8 == (ExprBase *)0x0) goto LAB_00179f83;
            goto LAB_00179e13;
          }
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          this = (ExprZeroInitialize *)CONCAT44(extraout_var_01,iVar7);
          ExprZeroInitialize::ExprZeroInitialize(this,source_00,ctx->typeVoid,address);
        }
        else {
          pEVar9 = AnalyzeExpression(ctx,pSVar3);
          pEVar9 = ResolveInitializerValue(ctx,pSVar3,pEVar9);
          pTVar2 = variable->type;
          if ((((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x13)) ||
              ((pTVar4 = (TypeStruct *)pEVar9->type, pTVar4 != (TypeStruct *)0x0 &&
               ((pTVar4->super_TypeBase).typeID == 0x13)))) ||
             ((pTVar4 == ctx->typeAutoArray || (pTVar4 == ctx->typeAutoRef)))) {
            this = (ExprZeroInitialize *)CreateAssignment(ctx,pEVar9->source,pEVar8,pEVar9);
          }
          else {
            pEVar8 = CreateCast(ctx,pEVar9->source,pEVar9,(TypeBase *)pTVar2[1]._vptr_TypeBase,false
                               );
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            this = (ExprZeroInitialize *)CONCAT44(extraout_var_00,iVar7);
            pSVar3 = pEVar8->source;
            pTVar2 = ctx->typeVoid;
            (this->super_ExprBase).typeID = 0x20;
            (this->super_ExprBase).source = pSVar3;
            (this->super_ExprBase).type = pTVar2;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            (this->super_ExprBase).listed = false;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240fc0;
            this->address = address;
            this[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar8;
          }
        }
        IntrusiveList<ExprBase>::push_back(expressions,&this->super_ExprBase);
      }
    }
    else {
      do {
        bVar6 = InplaceStr::operator==(&variable->name->name,&pMVar11->variable->name->name);
        if (bVar6) break;
        pMVar11 = pMVar11->next;
      } while (pMVar11 != (MemberHandle *)0x0);
      if (!bVar6) goto LAB_00179cb1;
      local_48.begin = "$typeid";
      local_48.end = "";
      bVar6 = InplaceStr::operator==(&variable->name->name,&local_48);
      if (bVar6) goto LAB_00179cb1;
    }
LAB_00179f83:
    pMVar1 = pMVar1->next;
  } while( true );
}

Assistant:

void CreateDefaultConstructorCode(ExpressionContext &ctx, SynBase *source, TypeClass *classType, IntrusiveList<ExprBase> &expressions)
{
	for(MemberHandle *el = classType->members.head; el; el = el->next)
	{
		VariableData *variable = el->variable;

		if(TypeClass *base = classType->baseClass)
		{
			bool found = false;

			for(MemberHandle *baseMember = base->members.head; baseMember && !found; baseMember = baseMember->next)
				found = variable->name->name == baseMember->variable->name->name;

			if(found && variable->name->name != InplaceStr("$typeid"))
				continue;
		}

		SynBase *memberSource = el->source ? el->source : source;

		ExprBase *access = CreateVariableAccess(ctx, memberSource, variable, true);

		ExprBase *member = CreateGetAddress(ctx, source, access);

		if(variable->name->name == InplaceStr("$typeid"))
		{
			if(classType->baseClass)
			{
				assert(HasDefaultConstructor(ctx, memberSource, classType->baseClass));

				ExprBase *thisAccess = CreateVariableAccess(ctx, memberSource, IntrusiveList<SynIdentifier>(), InplaceStr("this"), false);

				if(!thisAccess)
					Stop(ctx, memberSource, "ERROR: 'this' variable is not available");

				ExprBase *cast = CreateCast(ctx, memberSource, thisAccess, ctx.GetReferenceType(classType->baseClass), true);

				if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, classType->baseClass, cast))
					expressions.push_back(call);
			}

			expressions.push_back(CreateAssignment(ctx, memberSource, member, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(memberSource, ctx.typeTypeID, classType)));
			continue;
		}

		if(el->initializer)
		{
			ExprBase *initializer = ResolveInitializerValue(ctx, el->initializer, AnalyzeExpression(ctx, el->initializer));

			TypeArray *arrType = getType<TypeArray>(variable->type);

			// Single-level array might be set with a single element at the point of definition
			if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
			{
				initializer = CreateCast(ctx, initializer->source, initializer, arrType->subType, false);

				expressions.push_back(new (ctx.get<ExprArraySetup>()) ExprArraySetup(initializer->source, ctx.typeVoid, member, initializer));
			}
			else
			{
				expressions.push_back(CreateAssignment(ctx, initializer->source, access, initializer));
			}
		}
		else if(HasDefaultConstructor(ctx, memberSource, variable->type))
		{
			if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, variable->type, member))
				expressions.push_back(call);
		}
		else
		{
			expressions.push_back(new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(memberSource, ctx.typeVoid, member));
		}
	}
}